

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void decompressBlockDiffFlipC
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  long local_88;
  
  if ((block_part1 & 2) == 0) {
    uVar18 = (block_part1 >> 0x1c) << 4 | block_part1 >> 0x1c;
    uVar17 = block_part1 >> 4 & 0xe;
    uVar2 = block_part2 >> 0x10;
    uVar10 = block_part2 & 0xffff;
    uVar19 = (block_part1 >> 0x14 & 0xf) << 4 | block_part1 >> 0x14 & 0xf;
    uVar8 = (block_part1 >> 0xc & 0xf) << 4 | block_part1 >> 0xc & 0xf;
    lVar7 = (long)starty;
    lVar16 = (long)width;
    lVar14 = (long)channels;
    local_88 = (long)startx;
    if ((block_part1 & 1) == 0) {
      puVar11 = img + (lVar7 * lVar16 + (long)startx) * lVar14 + 2;
      uVar4 = 0;
      lVar3 = lVar7 + -1;
      puVar12 = puVar11;
      lVar13 = (long)startx;
      do {
        do {
          iVar6 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar10 >> (uVar4 & 0x1f) & 1) != 0) +
                                 (uVar2 >> ((byte)uVar4 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar17 << 4)
                          );
          iVar9 = iVar6 + uVar18;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-2] = (uint8)iVar9;
          iVar9 = iVar6 + uVar19;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-1] = (uint8)iVar9;
          iVar6 = iVar6 + uVar8;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          uVar4 = uVar4 + 1;
          *puVar11 = (uint8)iVar6;
          lVar3 = lVar3 + 1;
          puVar11 = puVar11 + lVar14 * lVar16;
        } while (lVar3 < starty + 3);
        puVar11 = puVar12 + lVar14;
        bVar1 = lVar13 <= local_88;
        lVar3 = lVar7 + -1;
        puVar12 = puVar11;
        lVar13 = lVar13 + 1;
      } while (bVar1);
    }
    else {
      puVar11 = img + (lVar7 * lVar16 + local_88) * lVar14 + 2;
      lVar3 = lVar7 + -1;
      uVar4 = 0;
      puVar12 = puVar11;
      do {
        do {
          uVar5 = uVar4;
          iVar6 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar10 >> (uVar5 & 0x1f) & 1) != 0) +
                                 (uVar2 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar17 << 4)
                          );
          iVar9 = iVar6 + uVar18;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-2] = (uint8)iVar9;
          iVar9 = iVar6 + uVar19;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-1] = (uint8)iVar9;
          iVar6 = iVar6 + uVar8;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          *puVar11 = (uint8)iVar6;
          lVar3 = lVar3 + 1;
          puVar11 = puVar11 + lVar14 * lVar16;
          uVar4 = uVar5 + 1;
        } while (lVar3 <= lVar7);
        puVar11 = puVar12 + lVar14;
        bVar1 = local_88 < startx + 3;
        lVar3 = lVar7 + -1;
        uVar4 = uVar5 + 3;
        local_88 = local_88 + 1;
        puVar12 = puVar11;
      } while (bVar1);
    }
    uVar17 = block_part1 >> 1 & 0xe;
    uVar18 = (block_part1 >> 0x18 & 0xf) << 4 | block_part1 >> 0x18 & 0xf;
    uVar19 = (block_part1 >> 0x10 & 0xf) << 4 | block_part1 >> 0x10 & 0xf;
    uVar8 = (block_part1 >> 8 & 0xf) << 4 | block_part1 >> 8 & 0xf;
    if ((block_part1 & 1) == 0) {
      puVar11 = img + (lVar7 * lVar16 + (long)(startx + 2)) * lVar14 + 2;
      uVar4 = 8;
      lVar3 = lVar7 + -1;
      puVar12 = puVar11;
      lVar13 = (long)(startx + 2);
      do {
        do {
          iVar6 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar10 >> (uVar4 & 0x1f) & 1) != 0) +
                                 (uVar2 >> ((byte)uVar4 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar17 << 4)
                          );
          iVar9 = iVar6 + uVar18;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-2] = (uint8)iVar9;
          iVar9 = iVar6 + uVar19;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-1] = (uint8)iVar9;
          iVar6 = iVar6 + uVar8;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          uVar4 = uVar4 + 1;
          *puVar11 = (uint8)iVar6;
          lVar3 = lVar3 + 1;
          puVar11 = puVar11 + lVar16 * lVar14;
        } while (lVar3 < starty + 3);
        puVar11 = puVar12 + lVar14;
        bVar1 = lVar13 < startx + 3;
        lVar3 = lVar7 + -1;
        puVar12 = puVar11;
        lVar13 = lVar13 + 1;
      } while (bVar1);
    }
    else {
      lVar13 = (long)(starty + 2) + -1;
      puVar11 = img + (lVar16 * (starty + 2) + (long)startx) * lVar14 + 2;
      lVar7 = lVar13;
      uVar4 = 2;
      puVar12 = puVar11;
      lVar3 = (long)startx;
      do {
        do {
          uVar5 = uVar4;
          iVar6 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar10 >> (uVar5 & 0x1f) & 1) != 0) +
                                 (uVar2 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar17 << 4)
                          );
          iVar9 = iVar6 + uVar18;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-2] = (uint8)iVar9;
          iVar9 = iVar6 + uVar19;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-1] = (uint8)iVar9;
          iVar6 = iVar6 + uVar8;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          *puVar11 = (uint8)iVar6;
          lVar7 = lVar7 + 1;
          puVar11 = puVar11 + lVar14 * lVar16;
          uVar4 = uVar5 + 1;
        } while (lVar7 < starty + 3);
        puVar11 = puVar12 + lVar14;
        bVar1 = lVar3 < startx + 3;
        lVar7 = lVar13;
        uVar4 = uVar5 + 3;
        puVar12 = puVar11;
        lVar3 = lVar3 + 1;
      } while (bVar1);
    }
  }
  else {
    uVar8 = block_part1 >> 0x13 & 0x1f;
    uVar18 = block_part1 >> 0xb & 0x1f;
    uVar17 = (block_part1 >> 0x1b) << 3 | block_part1 >> 0x1d;
    uVar19 = block_part1 >> 4 & 0xe;
    uVar2 = block_part2 >> 0x10;
    uVar10 = block_part2 & 0xffff;
    iVar6 = (uVar8 >> 2) + uVar8 * 8;
    iVar9 = (uVar18 >> 2) + uVar18 * 8;
    lVar3 = (long)starty;
    lVar14 = (long)width;
    lVar16 = (long)channels;
    lVar7 = (long)startx;
    if ((block_part1 & 1) == 0) {
      puVar11 = img + (lVar3 * lVar14 + (long)startx) * lVar16 + 2;
      uVar4 = 0;
      lVar13 = lVar3 + -1;
      lVar21 = (long)startx;
      puVar12 = puVar11;
      do {
        do {
          iVar20 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar10 >> (uVar4 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar4 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar19 << 4));
          iVar15 = iVar20 + uVar17;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          puVar11[-2] = (uint8)iVar15;
          iVar15 = iVar20 + iVar6;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          puVar11[-1] = (uint8)iVar15;
          iVar20 = iVar20 + iVar9;
          if (0xfe < iVar20) {
            iVar20 = 0xff;
          }
          if (iVar20 < 1) {
            iVar20 = 0;
          }
          uVar4 = uVar4 + 1;
          *puVar11 = (uint8)iVar20;
          lVar13 = lVar13 + 1;
          puVar11 = puVar11 + lVar16 * lVar14;
        } while (lVar13 < starty + 3);
        puVar11 = puVar12 + lVar16;
        bVar1 = lVar21 <= lVar7;
        lVar13 = lVar3 + -1;
        lVar21 = lVar21 + 1;
        puVar12 = puVar11;
      } while (bVar1);
    }
    else {
      puVar11 = img + (lVar3 * lVar14 + lVar7) * lVar16 + 2;
      lVar13 = lVar3 + -1;
      uVar4 = 0;
      puVar12 = puVar11;
      do {
        do {
          uVar5 = uVar4;
          iVar20 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar10 >> (uVar5 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar19 << 4));
          iVar15 = iVar20 + uVar17;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          puVar11[-2] = (uint8)iVar15;
          iVar15 = iVar20 + iVar6;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          puVar11[-1] = (uint8)iVar15;
          iVar20 = iVar20 + iVar9;
          if (0xfe < iVar20) {
            iVar20 = 0xff;
          }
          if (iVar20 < 1) {
            iVar20 = 0;
          }
          *puVar11 = (uint8)iVar20;
          lVar13 = lVar13 + 1;
          puVar11 = puVar11 + lVar16 * lVar14;
          uVar4 = uVar5 + 1;
        } while (lVar13 <= lVar3);
        puVar11 = puVar12 + lVar16;
        bVar1 = lVar7 < startx + 3;
        lVar13 = lVar3 + -1;
        uVar4 = uVar5 + 3;
        puVar12 = puVar11;
        lVar7 = lVar7 + 1;
      } while (bVar1);
    }
    uVar19 = ((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b);
    uVar8 = uVar8 + ((int)(block_part1 << 0xd) >> 0x1d);
    uVar18 = uVar18 + ((int)(block_part1 << 0x15) >> 0x1d);
    uVar17 = block_part1 >> 1 & 0xe;
    uVar19 = uVar19 * 8 & 0xff | (uVar19 & 0xff) >> 2;
    uVar8 = uVar8 * 8 & 0xff | (uVar8 & 0xff) >> 2;
    uVar18 = uVar18 * 8 & 0xff | (uVar18 & 0xff) >> 2;
    if ((block_part1 & 1) == 0) {
      puVar11 = img + (lVar3 * lVar14 + (long)(startx + 2)) * lVar16 + 2;
      uVar4 = 8;
      lVar7 = lVar3 + -1;
      puVar12 = puVar11;
      lVar13 = (long)(startx + 2);
      do {
        do {
          iVar6 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar10 >> (uVar4 & 0x1f) & 1) != 0) +
                                 (uVar2 >> ((byte)uVar4 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar17 << 4)
                          );
          iVar9 = iVar6 + uVar19;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-2] = (uint8)iVar9;
          iVar9 = iVar6 + uVar8;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-1] = (uint8)iVar9;
          iVar6 = iVar6 + uVar18;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          uVar4 = uVar4 + 1;
          *puVar11 = (uint8)iVar6;
          lVar7 = lVar7 + 1;
          puVar11 = puVar11 + lVar14 * lVar16;
        } while (lVar7 < starty + 3);
        puVar11 = puVar12 + lVar16;
        bVar1 = lVar13 < startx + 3;
        lVar7 = lVar3 + -1;
        puVar12 = puVar11;
        lVar13 = lVar13 + 1;
      } while (bVar1);
    }
    else {
      lVar13 = (long)(starty + 2) + -1;
      puVar11 = img + (lVar14 * (starty + 2) + (long)startx) * lVar16 + 2;
      lVar7 = lVar13;
      uVar4 = 2;
      lVar3 = (long)startx;
      puVar12 = puVar11;
      do {
        do {
          uVar5 = uVar4;
          iVar6 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar10 >> (uVar5 & 0x1f) & 1) != 0) +
                                 (uVar2 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar17 << 4)
                          );
          iVar9 = iVar6 + uVar19;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-2] = (uint8)iVar9;
          iVar9 = iVar6 + uVar8;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          puVar11[-1] = (uint8)iVar9;
          iVar6 = iVar6 + uVar18;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          *puVar11 = (uint8)iVar6;
          lVar7 = lVar7 + 1;
          puVar11 = puVar11 + lVar16 * lVar14;
          uVar4 = uVar5 + 1;
        } while (lVar7 < starty + 3);
        puVar11 = puVar12 + lVar16;
        bVar1 = lVar3 < startx + 3;
        lVar7 = lVar13;
        uVar4 = uVar5 + 3;
        lVar3 = lVar3 + 1;
        puVar12 = puVar11;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void decompressBlockDiffFlipC(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;

	diffbit = (GETBITSHIGH(block_part1, 1, 33));
	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	if( !diffbit )
	{
		// We have diffbit = 0.

		// First decode left part of block.
		avg_color[0]= GETBITSHIGH(block_part1, 4, 63);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 55);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 47);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode other part of block. 
		avg_color[0]= GETBITSHIGH(block_part1, 4, 59);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 51);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 43);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
	else
	{
		// We have diffbit = 1. 

//      63 62 61 60 59 58 57 56 55 54 53 52 51 50 49 48 47 46 45 44 43 42 41 40 39 38 37 36 35 34  33  32 
//      ---------------------------------------------------------------------------------------------------
//     | base col1    | dcol 2 | base col1    | dcol 2 | base col 1   | dcol 2 | table  | table  |diff|flip|
//     | R1' (5 bits) | dR2    | G1' (5 bits) | dG2    | B1' (5 bits) | dB2    | cw 1   | cw 2   |bit |bit |
//      ---------------------------------------------------------------------------------------------------
// 
// 
//     c) bit layout in bits 31 through 0 (in both cases)
// 
//      31 30 29 28 27 26 25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10  9  8  7  6  5  4  3   2   1  0
//      --------------------------------------------------------------------------------------------------
//     |       most significant pixel index bits       |         least significant pixel index bits       |  
//     | p| o| n| m| l| k| j| i| h| g| f| e| d| c| b| a| p| o| n| m| l| k| j| i| h| g| f| e| d| c | b | a |
//      --------------------------------------------------------------------------------------------------      

		// First decode left part of block.
		enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
		enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
		enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
		avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
		avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode right part of block. 
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		//  Calculale second color
		enc_color2[0]= enc_color1[0] + diff[0];
		enc_color2[1]= enc_color1[1] + diff[1];
		enc_color2[2]= enc_color1[2] + diff[2];

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
		avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
		avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
}